

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::PointerToMemberType::printRight
          (PointerToMemberType *this,OutputStream *s)

{
  bool bVar1;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *s_local;
  PointerToMemberType *this_local;
  
  local_18 = s;
  s_local = (OutputStream *)this;
  bVar1 = Node::hasArray(this->MemberType,s);
  if ((bVar1) || (bVar1 = Node::hasFunction(this->MemberType,local_18), bVar1)) {
    StringView::StringView(&local_28,")");
    OutputStream::operator+=(local_18,local_28);
  }
  (*this->MemberType->_vptr_Node[5])(this->MemberType,local_18);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (MemberType->hasArray(s) || MemberType->hasFunction(s))
      s += ")";
    MemberType->printRight(s);
  }